

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_80(QPDF *pdf,char *arg2)

{
  pointer pQVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  reference pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle *annot;
  pointer pQVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDF pdf2;
  QPDFWriter w2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8 [2];
  QPDFWriter w1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0 [3];
  QPDFObjectHandle old_annots;
  value_type page1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  value_type page2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_120;
  undefined1 local_110 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_100;
  QPDFAcroFormDocumentHelper afdh;
  QPDFMatrix m;
  undefined7 uStack_c7;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  QPDFPageObjectHelper local_60;
  
  QPDFMatrix::QPDFMatrix(&m);
  QPDFMatrix::translate(306.0,396.0);
  QPDFMatrix::scale(0.4,0.4);
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page1,p_Var2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&page2,"/Annots",(allocator<char> *)&old_fields);
  QPDFObjectHandle::getKey((string *)&old_annots);
  std::__cxx11::string::~string((string *)&page2);
  new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &old_fields._M_t._M_impl.super__Rb_tree_header._M_header;
  old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&afdh,pdf);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_110,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_annots);
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&afdh;
  QPDFAcroFormDocumentHelper::transformAnnotations
            (QVar5,(vector *)&new_annots,(vector *)&new_fields,(set *)&old_fields,&m,(QPDF *)0x0,
             (QPDFAcroFormDocumentHelper *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108);
  pQVar1 = new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pQVar4 = new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start; pQVar4 != pQVar1; pQVar4 = pQVar4 + 1) {
    QPDFObjectHandle::appendItem(&old_annots);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_100,&new_fields);
  QPDFAcroFormDocumentHelper::addAndRenameFormFields(&afdh,&local_100);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_100);
  QPDFMatrix::QPDFMatrix((QPDFMatrix *)&page2);
  m = (QPDFMatrix)page2.super_QPDFObjectHelper;
  uStack_c7 = page2._1_7_;
  QPDFMatrix::translate(612.0,0.0);
  QPDFMatrix::scale(-1.0,1.0);
  QPDF::QPDF(&pdf2);
  QPDF::processFile((char *)&pdf2,arg2);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w1,&pdf2);
  QPDFPageDocumentHelper::getAllPages();
  pvVar3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                     ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&w2,0);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&page2,pvVar3);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&w2);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page1);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_120;
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_60,QVar6);
  QPDFPageObjectHelper::copyAnnotations
            ((QPDFPageObjectHelper *)&page2,(QPDFMatrix *)&local_60,(QPDFAcroFormDocumentHelper *)&m
             ,(QPDFAcroFormDocumentHelper *)0x0);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  QPDFWriter::QPDFWriter(&w1,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&w1,0));
  QPDFWriter::setQDFMode(SUB81(&w1,0));
  QPDFWriter::write();
  QPDFWriter::QPDFWriter(&w2,&pdf2,"b.pdf");
  QPDFWriter::setStaticID(SUB81(&w2,0));
  QPDFWriter::setQDFMode(SUB81(&w2,0));
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1d0);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&page2);
  QPDF::~QPDF(&pdf2);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&afdh);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&old_fields._M_t);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_fields);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_annots);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&old_annots.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_80(QPDF& pdf, char const* arg2)
{
    // Exercise transform/copy annotations without passing in
    // QPDFAcroFormDocumentHelper pointers. The case of passing
    // them in is sufficiently exercised by testing through the
    // qpdf CLI.

    // The main file is a file that has lots of annotations. Arg2
    // is a file to copy annotations to.

    QPDFMatrix m;
    m.translate(306, 396);
    m.scale(0.4, 0.4);
    auto page1 = pdf.getAllPages().at(0);
    auto old_annots = page1.getKey("/Annots");
    // Transform annotations and copy them back to the same page.
    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    QPDFAcroFormDocumentHelper afdh(pdf);
    // Use defaults for from_qpdf and from_afdh.
    afdh.transformAnnotations(old_annots, new_annots, new_fields, old_fields, m);
    for (auto const& annot: new_annots) {
        old_annots.appendItem(annot);
    }
    afdh.addAndRenameFormFields(new_fields);

    m = QPDFMatrix();
    m.translate(612, 0);
    m.scale(-1, 1);
    QPDF pdf2;
    pdf2.processFile(arg2);
    auto page2 = QPDFPageDocumentHelper(pdf2).getAllPages().at(0);
    page2.copyAnnotations(page1, m);

    QPDFWriter w1(pdf, "a.pdf");
    w1.setStaticID(true);
    w1.setQDFMode(true);
    w1.write();

    QPDFWriter w2(pdf2, "b.pdf");
    w2.setStaticID(true);
    w2.setQDFMode(true);
    w2.write();
}